

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void CLIntercept::contextCallbackCaller(char *errinfo,void *private_info,size_t cb,void *user_data)

{
  long in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  char *in_RDI;
  SContextCallbackInfo *pContextCallbackInfo;
  size_t in_stack_00000128;
  void *in_stack_00000130;
  string *in_stack_00000138;
  CLIntercept *in_stack_00000140;
  allocator local_49;
  string local_48 [32];
  long local_28;
  undefined8 local_18;
  undefined8 local_10;
  char *local_8;
  
  local_28 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,in_RDI,&local_49);
  contextCallback(in_stack_00000140,in_stack_00000138,in_stack_00000130,in_stack_00000128);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if (*(long *)(local_28 + 8) != 0) {
    (**(code **)(local_28 + 8))(local_8,local_10,local_18,*(undefined8 *)(local_28 + 0x10));
  }
  return;
}

Assistant:

void CLIntercept::contextCallbackCaller(
    const char* errinfo,
    const void* private_info,
    size_t cb,
    void* user_data )
{
    SContextCallbackInfo*   pContextCallbackInfo =
        (SContextCallbackInfo*)user_data;

    pContextCallbackInfo->pIntercept->contextCallback(
        errinfo,
        private_info,
        cb );
    if( pContextCallbackInfo->pApplicationCallback )
    {
        pContextCallbackInfo->pApplicationCallback(
            errinfo,
            private_info,
            cb,
            pContextCallbackInfo->pUserData );
    }
}